

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_bind_list.c
# Opt level: O0

int mpt_output_bind_list(mpt_output *out,mpt_node *conf)

{
  _func_ssize_t_mpt_output_ptr_size_t_void_ptr *p_Var1;
  int iVar2;
  char *__s;
  size_t sVar3;
  ssize_t local_50;
  ssize_t len;
  char *pcStack_40;
  mpt_msgtype mt;
  char *dest;
  char *src;
  mpt_metatype *meta;
  mpt_node *pmStack_20;
  int nbind;
  mpt_node *conf_local;
  mpt_output *out_local;
  
  pmStack_20 = conf;
  if (conf == (mpt_node *)0x0) {
    out_local._4_4_ = -1;
  }
  else {
    do {
      pcStack_40 = (char *)mpt_node_ident(pmStack_20);
      if (((pcStack_40 != (char *)0x0) && (pmStack_20->_meta != (mpt_metatype *)0x0)) &&
         (__s = (char *)mpt_convertable_data(pmStack_20->_meta,0), __s != (char *)0x0)) {
        len._6_1_ = 0xc;
        len._7_1_ = 0x32;
        iVar2 = (*out->_vptr->await)(out,(_func_int_void_ptr_mpt_message_ptr *)0x0,(void *)0x0);
        if (iVar2 < 0) {
          return -1;
        }
        local_50 = (*out->_vptr->push)(out,2,(void *)((long)&len + 6));
        if (-1 < local_50) {
          p_Var1 = out->_vptr->push;
          sVar3 = strlen(__s);
          local_50 = (*p_Var1)(out,sVar3 + 1,__s);
          if (-1 < local_50) {
            p_Var1 = out->_vptr->push;
            sVar3 = strlen(pcStack_40);
            local_50 = (*p_Var1)(out,sVar3,pcStack_40);
            if ((-1 < local_50) &&
               (local_50 = (*out->_vptr->push)(out,0,(void *)0x0), -1 < local_50))
            goto LAB_0010ad2e;
          }
          (*out->_vptr->push)(out,1,(void *)0x0);
        }
LAB_0010ad2e:
        if (local_50 < 0) {
          return -1;
        }
      }
      pmStack_20 = pmStack_20->next;
    } while (pmStack_20 != (mpt_node *)0x0);
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

extern int mpt_output_bind_list(MPT_INTERFACE(output) *out, const MPT_STRUCT(node) *conf)
{
	int nbind = 0;
	
	if (!conf) {
		return MPT_ERROR(BadArgument);
	}
	do {
		MPT_INTERFACE(metatype) *meta;
		const char *src, *dest;
		MPT_STRUCT(msgtype) mt;
		ssize_t len;
		
		if (!(dest = mpt_node_ident(conf))) {
			continue;
		}
		if (!(meta = conf->_meta) || !(src = mpt_convertable_data((MPT_INTERFACE(convertable) *) meta, 0))) {
			continue;
		}
		mt.cmd = MPT_MESGTYPE(Graphic);
		mt.arg = MPT_MESGGRF(BindingAdd) | MPT_MESGGRF(BindingParse);
		
		if ((len = out->_vptr->await(out, 0, 0)) < 0) {
			return nbind ? nbind : -1;
		}
		if ((len = out->_vptr->push(out, sizeof(mt), &mt)) >= 0) {
			if ((len = out->_vptr->push(out, strlen(src)+1, src)) < 0
			    || (len = out->_vptr->push(out, strlen(dest), dest)) < 0
			    || (len = out->_vptr->push(out, 0, 0)) < 0) {
				out->_vptr->push(out, 1, 0);
			}
		}
		if (len < 0) {
			return nbind ? nbind : -1;
		}
	} while ((conf = conf->next));
	
	return nbind;
}